

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

bool __thiscall version_struct::operator>=(version_struct *this,char *v_str)

{
  bool bVar1;
  version_struct v_tmp;
  version_struct local_30;
  version_struct local_20;
  
  from_string(&local_20,v_str);
  local_30.major = local_20.major;
  local_30.minor = local_20.minor;
  local_30.rev = local_20.rev;
  bVar1 = operator>=(this,&local_30);
  return bVar1;
}

Assistant:

bool operator>=(const char* v_str)
  {
    version_struct v_tmp(v_str);
    return (*this >= v_tmp);
  }